

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O3

void MARGINAL::make_marginal<true>(data *sm,example *ec)

{
  byte bVar1;
  shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar2;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *this;
  features *pfVar3;
  float *pfVar4;
  iterator iVar5;
  mapped_type *pmVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  uint64_t *puVar9;
  long lVar10;
  ulong *puVar11;
  features *pfVar12;
  key_type *pkVar13;
  features *pfVar14;
  ulong i;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  float *pfVar15;
  float *pfVar16;
  byte bVar17;
  float v;
  float extraout_XMM0_Da;
  uint64_t key;
  key_type local_118;
  double local_110;
  features *local_108;
  example *local_100;
  float local_f8;
  float local_f4;
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  *local_f0;
  byte *local_e8;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *local_e0;
  undefined8 local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  undefined4 uStack_c8;
  undefined4 local_c4;
  features *local_c0;
  features *local_b8;
  vw *local_b0;
  v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_a8;
  uint64_t local_a0;
  key_type local_98;
  undefined8 local_90;
  undefined4 local_88;
  undefined4 local_84;
  undefined8 local_80;
  float local_38;
  
  bVar17 = 0;
  local_b0 = sm->all;
  puVar9 = &(local_b0->weights).dense_weights._weight_mask;
  if ((local_b0->weights).sparse != false) {
    puVar9 = &(local_b0->weights).sparse_weights._weight_mask;
  }
  local_a0 = *puVar9;
  local_f8 = (ec->l).simple.label;
  sm->average_pred = 0.0;
  sm->net_weight = 0.0;
  sm->net_feature_weight = 0.0;
  sm->alg_loss = 0.0;
  local_e8 = (ec->super_example_predict).indices._begin;
  if (local_e8 != (ec->super_example_predict).indices._end) {
    local_b8 = (ec->super_example_predict).feature_space;
    local_c0 = sm->temp;
    local_e0 = &(sm->marginals)._M_h;
    local_f0 = (_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&sm->expert_state;
    local_100 = ec;
    do {
      pfVar3 = local_c0;
      bVar1 = *local_e8;
      if (sm->id_features[bVar1] == true) {
        local_108 = local_c0 + bVar1;
        pfVar12 = local_108;
        pkVar13 = &local_98;
        for (lVar10 = 0xd; lVar10 != 0; lVar10 = lVar10 + -1) {
          *pkVar13 = (key_type)(pfVar12->values)._begin;
          pfVar12 = (features *)((long)pfVar12 + (ulong)bVar17 * -0x10 + 8);
          pkVar13 = pkVar13 + (ulong)bVar17 * -2 + 1;
        }
        pfVar12 = local_b8 + bVar1;
        pfVar14 = local_108;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pfVar14->values)._begin = (pfVar12->values)._begin;
          pfVar12 = (features *)((long)pfVar12 + (ulong)bVar17 * -0x10 + 8);
          pfVar14 = (features *)((long)pfVar14 + (ulong)bVar17 * -0x10 + 8);
        }
        local_c0[bVar1].sum_feat_sq = local_b8[bVar1].sum_feat_sq;
        pkVar13 = &local_98;
        pfVar12 = local_b8 + bVar1;
        for (lVar10 = 0xc; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pfVar12->values)._begin = (float *)*pkVar13;
          pkVar13 = pkVar13 + (ulong)bVar17 * -2 + 1;
          pfVar12 = (features *)((long)pfVar12 + (ulong)bVar17 * -0x10 + 8);
        }
        local_b8[bVar1].sum_feat_sq = local_38;
        pfVar12 = local_b8 + *local_e8;
        features::clear(pfVar12);
        pfVar15 = pfVar3[bVar1].values._begin;
        pfVar4 = pfVar3[bVar1].values._end;
        if (pfVar15 != pfVar4) {
          local_a8 = &pfVar12->space_names;
          puVar11 = (local_108->indicies)._begin + 1;
          this_00 = local_e0;
          pfVar15 = pfVar15 + 1;
          do {
            if (pfVar15 == pfVar4) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: id feature namespace has ",0x22);
              poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar8," features. Should be a multiple of 2",0x24);
              std::ios::widen((char)poVar8->_vptr_basic_ostream[-3] + (char)poVar8);
              std::ostream::put((char)poVar8);
              std::ostream::flush();
              break;
            }
            if ((((pfVar15[-1] != 1.0) || (NAN(pfVar15[-1]))) || (*pfVar15 != 1.0)) ||
               (NAN(*pfVar15))) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"warning: bad id features, must have value 1.",0x2c);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x18);
              std::ostream::put(-0x18);
              std::ostream::flush();
            }
            else {
              i = puVar11[-1] & local_a0;
              local_118 = (*puVar11 & local_a0) + (local_100->super_example_predict).ft_offset;
              iVar5 = std::
                      _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                      ::find(this_00,&local_118);
              if (iVar5.
                  super__Node_iterator_base<std::pair<const_unsigned_long,_std::pair<double,_double>_>,_false>
                  ._M_cur == (__node_type *)0x0) {
                local_90._0_4_ = sm->initial_numerator;
                local_90._4_4_ = sm->initial_denominator;
                local_98 = local_118;
                std::
                _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                ::_M_emplace<std::pair<unsigned_long,std::pair<float,float>>>
                          ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<double,double>>,std::allocator<std::pair<unsigned_long_const,std::pair<double,double>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                            *)this_00,&local_98);
                if (sm->compete == true) {
                  local_d0 = 0x3f800000;
                  local_d8 = 0;
                  local_c4 = 0x3f800000;
                  local_cc = 0;
                  uStack_c8 = 0;
                  local_98 = local_118;
                  local_80 = 0x3f80000000000000;
                  local_90 = 0;
                  local_88 = 0x3f800000;
                  local_84 = 0;
                  std::
                  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>,std::allocator<std::pair<unsigned_long_const,std::pair<MARGINAL::expert,MARGINAL::expert>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  ::
                  _M_emplace<std::pair<unsigned_long,std::pair<MARGINAL::expert,MARGINAL::expert>>>
                            (local_f0,&local_98);
                }
              }
              pmVar6 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_118);
              local_110 = pmVar6->first;
              pmVar6 = std::__detail::
                       _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<double,_double>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<double,_double>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)this_00,&local_118);
              v = (float)(local_110 / pmVar6->second);
              local_110 = (double)CONCAT44(local_110._4_4_,v);
              features::push_back(pfVar12,v,i);
              psVar2 = (local_108->space_names)._begin;
              if (psVar2 != (local_108->space_names)._end) {
                v_array<std::shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::push_back(local_a8,(shared_ptr<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      *)((long)psVar2 +
                                        ((long)(pfVar12->values)._end -
                                        (long)(pfVar12->values)._begin) * 8 + -0x20));
              }
              this = local_f0;
              this_00 = local_e0;
              if (sm->compete == true) {
                pmVar7 = std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)local_f0,&local_118);
                local_f4 = (pmVar7->first).weight;
                sm->average_pred = local_f4 * local_110._0_4_ + sm->average_pred;
                sm->net_weight = sm->net_weight + local_f4;
                pmVar7 = std::__detail::
                         _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<MARGINAL::expert,_MARGINAL::expert>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                       *)this,&local_118);
                sm->net_feature_weight = (pmVar7->second).weight + sm->net_feature_weight;
                (*local_b0->loss->_vptr_loss_function[1])
                          (local_110._0_4_,local_f8,local_b0->loss,local_b0->sd);
                sm->alg_loss = extraout_XMM0_Da * local_f4 + sm->alg_loss;
                this_00 = local_e0;
              }
            }
            pfVar4 = (local_108->values)._end;
            puVar11 = puVar11 + 2;
            pfVar16 = pfVar15 + 1;
            pfVar15 = pfVar15 + 2;
          } while (pfVar16 != pfVar4);
        }
      }
      local_e8 = local_e8 + 1;
    } while (local_e8 != (local_100->super_example_predict).indices._end);
  }
  return;
}

Assistant:

void make_marginal(data& sm, example& ec)
{
  uint64_t mask = sm.all->weights.mask();
  float label = ec.l.simple.label;
  vw& all = *sm.all;
  sm.alg_loss = 0.;
  sm.net_weight = 0.;
  sm.net_feature_weight = 0.;
  sm.average_pred = 0.;

  for (example::iterator i = ec.begin(); i != ec.end(); ++i)
  {
    namespace_index n = i.index();
    if (sm.id_features[n])
    {
      std::swap(sm.temp[n], *i);
      features& f = *i;
      f.clear();
      for (features::iterator j = sm.temp[n].begin(); j != sm.temp[n].end(); ++j)
      {
        float first_value = j.value();
        uint64_t first_index = j.index() & mask;
        if (++j == sm.temp[n].end())
        {
          cout << "warning: id feature namespace has " << sm.temp[n].size() << " features. Should be a multiple of 2"
               << endl;
          break;
        }
        float second_value = j.value();
        uint64_t second_index = j.index() & mask;
        if (first_value != 1. || second_value != 1.)
        {
          cout << "warning: bad id features, must have value 1." << endl;
          continue;
        }
        uint64_t key = second_index + ec.ft_offset;
        if (sm.marginals.find(key) == sm.marginals.end())  // need to initialize things.
        {
          sm.marginals.insert(make_pair(key, make_pair(sm.initial_numerator, sm.initial_denominator)));
          if (sm.compete)
          {
            expert e = {0, 0, 1.};
            sm.expert_state.insert(make_pair(key, make_pair(e, e)));
          }
        }
        float marginal_pred = (float)(sm.marginals[key].first / sm.marginals[key].second);
        f.push_back(marginal_pred, first_index);
        if (!sm.temp[n].space_names.empty())
          f.space_names.push_back(sm.temp[n].space_names[2 * (f.size() - 1)]);

        if (sm.compete)  // compute the prediction from the marginals using the weights
        {
          float weight = sm.expert_state[key].first.weight;
          sm.average_pred += weight * marginal_pred;
          sm.net_weight += weight;
          sm.net_feature_weight += sm.expert_state[key].second.weight;
          if (is_learn)
            sm.alg_loss += weight * all.loss->getLoss(all.sd, marginal_pred, label);
        }
      }
    }
  }
}